

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StressTest.cpp
# Opt level: O3

void TestObject::Visit(Recycler *recycler,TestObject *root)

{
  TestObject *this;
  bool bVar1;
  Recycler *pRVar2;
  BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this_01;
  Type *pTVar3;
  int index;
  undefined1 local_70 [8];
  TrackAllocData data;
  bool local_31;
  
  local_70 = (undefined1  [8])
             &JsUtil::
              BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_280c77f;
  data.filename._0_4_ = 0x6c;
  data._32_8_ = root;
  pRVar2 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
  this_00 = (BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)new<Memory::Recycler>(0x38,pRVar2,0x387914);
  (this_00->buckets).ptr = (int *)0x0;
  (this_00->entries).ptr = (SimpleDictionaryEntry<Memory::WriteBarrierPtr<TestObject>,_bool> *)0x0;
  this_00->alloc = recycler;
  this_00->size = 0;
  this_00->bucketCount = 0;
  this_00->count = 0;
  this_00->freeCount = 0;
  this_00->modFunctionIndex = 0x4b;
  this_00->stats = (Type)0x0;
  local_70 = (undefined1  [8])
             &JsUtil::List<TestObject*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>
              ::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_280c77f;
  data.filename._0_4_ = 0x6d;
  pRVar2 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_70);
  this_01 = (List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
            new<Memory::Recycler>(0x30,pRVar2,0x387914);
  (this_01->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).alloc = recycler;
  (this_01->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>)._vptr_ReadOnlyList
       = (_func_int **)&PTR_IsReadOnly_014da2b0;
  (this_01->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr =
       (WriteBarrierPtr<TestObject> *)0x0;
  (this_01->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count = 0;
  this_01->length = 0;
  this_01->increment = 4;
  JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
            (this_01,(TestObject **)&data.line);
  local_70[0] = 1;
  JsUtil::
  BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
  ::
  Insert<(JsUtil::BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
            ((BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              *)this_00,(TestObject **)&data.line,(bool *)local_70);
  if (0 < (this_01->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).count) {
    do {
      pTVar3 = JsUtil::
               List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
               Item(this_01,0);
      this = pTVar3->ptr;
      Js::
      CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
      ::RemoveAt((CopyRemovePolicy<JsUtil::List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_true>
                  *)&this_01->field_0x28,this_01,0);
      CheckCookie(this);
      if (0 < this->pointerCount) {
        index = 0;
        do {
          local_70 = (undefined1  [8])Get(this,index);
          if (local_70 != (undefined1  [8])0x0) {
            bVar1 = JsUtil::
                    BaseDictionary<TestObject_*,_bool,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                    ::ContainsKey(this_00,(TestObject **)local_70);
            if (!bVar1) {
              local_31 = true;
              JsUtil::
              BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::
              Insert<(JsUtil::BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                        ((BaseDictionary<TestObject*,bool,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)this_00,(TestObject **)local_70,&local_31);
              JsUtil::
              List<TestObject_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
              Add(this_01,(TestObject **)local_70);
            }
          }
          index = index + 1;
        } while (index < this->pointerCount);
      }
    } while (0 < (this_01->super_ReadOnlyList<TestObject_*,_Memory::Recycler,_DefaultComparer>).
                 count);
  }
  return;
}

Assistant:

void TestObject::Visit(Recycler *recycler, TestObject *root)
{
    Visit(recycler, root, [](TestObject*) { });
}